

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O1

void ktxTexture_rowInfo(ktxTexture *This,ktx_uint32_t level,ktx_uint32_t *numRows,
                       ktx_uint32_t *pRowLengthBytes,ktx_uint32_t *pRowPadding)

{
  ktxTexture_protected *pkVar1;
  ktx_uint32_t kVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  
  if (This == (ktxTexture *)0x0) {
    __assert_fail("This != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture.c"
                  ,0x32f,
                  "void ktxTexture_rowInfo(ktxTexture *, ktx_uint32_t, ktx_uint32_t *, ktx_uint32_t *, ktx_uint32_t *)"
                 );
  }
  if (This->isCompressed != true) {
    pkVar1 = This->_protected;
    if ((((pkVar1->_formatSize).blockWidth == 1) && ((pkVar1->_formatSize).blockHeight == 1)) &&
       ((pkVar1->_formatSize).blockDepth == 1)) {
      uVar3 = This->baseWidth >> ((byte)level & 0x1f);
      uVar4 = This->baseHeight >> ((byte)level & 0x1f);
      *numRows = uVar4 + (uVar4 == 0);
      uVar3 = (uVar3 + (uVar3 == 0)) * (pkVar1->_formatSize).blockSizeInBits >> 3;
      fVar5 = (float)uVar3;
      auVar6 = ZEXT416((uint)(fVar5 * 0.25));
      auVar6 = roundss(auVar6,auVar6,10);
      kVar2 = (ktx_uint32_t)(long)(auVar6._0_4_ * 4.0 - fVar5);
      *pRowLengthBytes = uVar3 + kVar2;
      *pRowPadding = kVar2;
      return;
    }
    __assert_fail("prtctd->_formatSize.blockWidth == 1U && prtctd->_formatSize.blockHeight == 1U && prtctd->_formatSize.blockDepth == 1U"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture.c"
                  ,0x334,
                  "void ktxTexture_rowInfo(ktxTexture *, ktx_uint32_t, ktx_uint32_t *, ktx_uint32_t *, ktx_uint32_t *)"
                 );
  }
  __assert_fail("!This->isCompressed",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture.c"
                ,0x331,
                "void ktxTexture_rowInfo(ktxTexture *, ktx_uint32_t, ktx_uint32_t *, ktx_uint32_t *, ktx_uint32_t *)"
               );
}

Assistant:

void
ktxTexture_rowInfo(ktxTexture* This, ktx_uint32_t level,
                   ktx_uint32_t* numRows, ktx_uint32_t* pRowLengthBytes,
                   ktx_uint32_t* pRowPadding)
{
    DECLARE_PROTECTED(ktxTexture);
    struct blockCount {
        ktx_uint32_t x;
    } blockCount;

    assert (This != NULL);

    assert(!This->isCompressed);
    assert(prtctd->_formatSize.blockWidth == 1U
           && prtctd->_formatSize.blockHeight == 1U
           && prtctd->_formatSize.blockDepth == 1U);

    blockCount.x = MAX(1, (This->baseWidth / prtctd->_formatSize.blockWidth)  >> level);
    *numRows = MAX(1, (This->baseHeight / prtctd->_formatSize.blockHeight)  >> level);

    *pRowLengthBytes = blockCount.x * prtctd->_formatSize.blockSizeInBits / 8;
    *pRowPadding = padRow(pRowLengthBytes);
}